

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModelUtils.cpp
# Opt level: O0

bool hasNamesWithSpaces(HighsLogOptions *log_options,HighsInt num_name,
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *names)

{
  const_reference pvVar1;
  long lVar2;
  undefined8 uVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  int in_ESI;
  HighsLogOptions *in_RDI;
  size_t space_pos;
  HighsInt ix;
  HighsInt num_names_with_spaces;
  int local_20;
  uint local_1c;
  
  local_1c = 0;
  for (local_20 = 0; local_20 < in_ESI; local_20 = local_20 + 1) {
    pvVar1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](in_RDX,(long)local_20);
    lVar2 = std::__cxx11::string::find((char *)pvVar1,0x86ffca);
    if ((lVar2 != -1) && (local_1c == 0)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](in_RDX,(long)local_20);
      uVar3 = std::__cxx11::string::c_str();
      highsLogDev(in_RDI,kInfo,"Name |%s| contains a space character in position %d\n",uVar3,lVar2);
      local_1c = 1;
    }
  }
  if (local_1c != 0) {
    highsLogDev(in_RDI,kInfo,"There are %d names with spaces\n",(ulong)local_1c);
  }
  return local_1c != 0;
}

Assistant:

bool hasNamesWithSpaces(const HighsLogOptions& log_options,
                        const HighsInt num_name,
                        const std::vector<std::string>& names) {
  HighsInt num_names_with_spaces = 0;
  for (HighsInt ix = 0; ix < num_name; ix++) {
    size_t space_pos = names[ix].find(" ");
    if (space_pos != std::string::npos) {
      if (num_names_with_spaces == 0) {
        highsLogDev(
            log_options, HighsLogType::kInfo,
            "Name |%s| contains a space character in position %" HIGHSINT_FORMAT
            "\n",
            names[ix].c_str(), space_pos);
        num_names_with_spaces++;
      }
    }
  }
  if (num_names_with_spaces)
    highsLogDev(log_options, HighsLogType::kInfo,
                "There are %" HIGHSINT_FORMAT " names with spaces\n",
                num_names_with_spaces);
  return num_names_with_spaces > 0;
}